

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_paddusb_mips(uint64_t fs,uint64_t ft)

{
  char cVar1;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [15];
  undefined1 auVar17 [14];
  undefined1 auVar18 [15];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  uint uVar24;
  undefined1 auVar25 [15];
  undefined1 auVar26 [14];
  uint uVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [11];
  undefined1 auVar39 [13];
  undefined1 auVar40 [14];
  undefined1 auVar41 [15];
  undefined1 auVar42 [11];
  undefined1 auVar43 [14];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  uint6 uVar48;
  uint6 uVar49;
  ushort uVar50;
  undefined1 auVar51 [16];
  short sVar52;
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined4 uVar53;
  undefined6 uVar54;
  undefined8 uVar55;
  undefined1 auVar56 [12];
  undefined1 auVar57 [14];
  undefined1 auVar59 [16];
  
  auVar18._8_6_ = 0;
  auVar18._0_8_ = fs;
  auVar18[0xe] = (char)(fs >> 0x38);
  auVar21._8_4_ = 0;
  auVar21._0_8_ = fs;
  auVar21[0xc] = (char)(fs >> 0x30);
  auVar21._13_2_ = auVar18._13_2_;
  auVar23._8_4_ = 0;
  auVar23._0_8_ = fs;
  auVar23._12_3_ = auVar21._12_3_;
  uVar27 = auVar23._11_4_;
  auVar28._8_2_ = 0;
  auVar28._0_8_ = fs;
  auVar28[10] = (char)(fs >> 0x28);
  auVar28._11_4_ = uVar27;
  auVar30._8_2_ = 0;
  auVar30._0_8_ = fs;
  auVar30._10_5_ = auVar28._10_5_;
  auVar32[8] = (char)(fs >> 0x20);
  auVar32._0_8_ = fs;
  auVar32._9_6_ = auVar30._9_6_;
  auVar36._7_8_ = 0;
  auVar36._0_7_ = auVar32._8_7_;
  Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),(char)(fs >> 0x18));
  auVar44._9_6_ = 0;
  auVar44._0_9_ = Var37;
  auVar38._1_10_ = SUB1510(auVar44 << 0x30,5);
  auVar38[0] = (char)(fs >> 0x10);
  auVar45._11_4_ = 0;
  auVar45._0_11_ = auVar38;
  auVar39._1_12_ = SUB1512(auVar45 << 0x20,3);
  auVar39[0] = (char)(fs >> 8);
  uVar50 = CONCAT11(0,(byte)fs);
  auVar35._2_13_ = auVar39;
  auVar35._0_2_ = uVar50;
  auVar19._10_2_ = 0;
  auVar19._0_10_ = auVar35._0_10_;
  auVar19._12_2_ = (short)Var37;
  uVar48 = CONCAT42(auVar19._10_4_,auVar38._0_2_);
  auVar40._6_8_ = 0;
  auVar40._0_6_ = uVar48;
  auVar16._8_6_ = 0;
  auVar16._0_8_ = ft;
  auVar16[0xe] = (char)(ft >> 0x38);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = ft;
  auVar20[0xc] = (char)(ft >> 0x30);
  auVar20._13_2_ = auVar16._13_2_;
  auVar22._8_4_ = 0;
  auVar22._0_8_ = ft;
  auVar22._12_3_ = auVar20._12_3_;
  uVar24 = auVar22._11_4_;
  auVar25._8_2_ = 0;
  auVar25._0_8_ = ft;
  auVar25[10] = (char)(ft >> 0x28);
  auVar25._11_4_ = uVar24;
  auVar29._8_2_ = 0;
  auVar29._0_8_ = ft;
  auVar29._10_5_ = auVar25._10_5_;
  auVar31[8] = (char)(ft >> 0x20);
  auVar31._0_8_ = ft;
  auVar31._9_6_ = auVar29._9_6_;
  auVar41._7_8_ = 0;
  auVar41._0_7_ = auVar31._8_7_;
  Var37 = CONCAT81(SUB158(auVar41 << 0x40,7),(char)(ft >> 0x18));
  auVar46._9_6_ = 0;
  auVar46._0_9_ = Var37;
  auVar42._1_10_ = SUB1510(auVar46 << 0x30,5);
  auVar42[0] = (char)(ft >> 0x10);
  auVar47._11_4_ = 0;
  auVar47._0_11_ = auVar42;
  auVar33[2] = (char)(ft >> 8);
  auVar33._0_2_ = (ushort)ft;
  auVar33._3_12_ = SUB1512(auVar47 << 0x20,3);
  auVar34._2_13_ = auVar33._2_13_;
  auVar34._0_2_ = (ushort)ft & 0xff;
  auVar61._0_4_ = (uint)auVar31._8_2_ + (uint)auVar32._8_2_;
  auVar61._4_4_ = (uint)auVar25._10_2_ + (uint)auVar28._10_2_;
  auVar61._8_4_ = (uVar24 >> 8 & 0xffff) + (uVar27 >> 8 & 0xffff);
  auVar61._12_4_ = (uVar24 >> 0x18) + (uVar27 >> 0x18);
  auVar17._10_2_ = 0;
  auVar17._0_10_ = auVar34._0_10_;
  auVar17._12_2_ = (short)Var37;
  uVar49 = CONCAT42(auVar17._10_4_,auVar42._0_2_);
  auVar43._6_8_ = 0;
  auVar43._0_6_ = uVar49;
  auVar26._4_2_ = auVar33._2_2_;
  auVar26._0_4_ = auVar34._0_4_;
  auVar26._6_8_ = SUB148(auVar43 << 0x40,6);
  auVar60._0_4_ = (auVar34._0_4_ & 0xffff) + (uint)uVar50;
  auVar60._4_4_ = auVar26._4_4_ + (int)CONCAT82(SUB148(auVar40 << 0x40,6),auVar39._0_2_);
  auVar60._8_4_ = (int)uVar49 + (int)uVar48;
  auVar60._12_4_ = (auVar17._10_4_ >> 0x10) + (auVar19._10_4_ >> 0x10);
  auVar51._0_4_ = -(uint)(auVar61._0_4_ < (int)DAT_00d60a50);
  auVar51._4_4_ = -(uint)(auVar61._4_4_ < DAT_00d60a50._4_4_);
  auVar51._8_4_ = -(uint)(auVar61._8_4_ < DAT_00d60a50._8_4_);
  auVar51._12_4_ = -(uint)(auVar61._12_4_ < DAT_00d60a50._12_4_);
  auVar51 = ~auVar51 & _DAT_00d60a50 | auVar61 & auVar51;
  auVar58._0_4_ = -(uint)(auVar60._0_4_ < (int)DAT_00d60a50);
  auVar58._4_4_ = -(uint)(auVar60._4_4_ < DAT_00d60a50._4_4_);
  auVar58._8_4_ = -(uint)(auVar60._8_4_ < DAT_00d60a50._8_4_);
  auVar58._12_4_ = -(uint)(auVar60._12_4_ < DAT_00d60a50._12_4_);
  auVar58 = ~auVar58 & _DAT_00d60a50 | auVar60 & auVar58;
  sVar9 = auVar58._0_2_;
  cVar1 = (0 < sVar9) * (sVar9 < 0x100) * auVar58[0] - (0xff < sVar9);
  sVar9 = auVar58._2_2_;
  sVar52 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar58[2] - (0xff < sVar9),cVar1);
  sVar9 = auVar58._4_2_;
  cVar2 = (0 < sVar9) * (sVar9 < 0x100) * auVar58[4] - (0xff < sVar9);
  sVar9 = auVar58._6_2_;
  uVar53 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar58[6] - (0xff < sVar9),
                    CONCAT12(cVar2,sVar52));
  sVar9 = auVar58._8_2_;
  cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar58[8] - (0xff < sVar9);
  sVar9 = auVar58._10_2_;
  uVar54 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar58[10] - (0xff < sVar9),
                    CONCAT14(cVar3,uVar53));
  sVar9 = auVar58._12_2_;
  cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar58[0xc] - (0xff < sVar9);
  sVar9 = auVar58._14_2_;
  uVar55 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar58[0xe] - (0xff < sVar9),
                    CONCAT16(cVar4,uVar54));
  sVar9 = auVar51._0_2_;
  cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar51[0] - (0xff < sVar9);
  sVar9 = auVar51._2_2_;
  auVar56._0_10_ =
       CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar51[2] - (0xff < sVar9),CONCAT18(cVar5,uVar55));
  sVar9 = auVar51._4_2_;
  cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar51[4] - (0xff < sVar9);
  auVar56[10] = cVar6;
  sVar9 = auVar51._6_2_;
  auVar56[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar51[6] - (0xff < sVar9);
  sVar9 = auVar51._8_2_;
  cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar51[8] - (0xff < sVar9);
  auVar57[0xc] = cVar7;
  auVar57._0_12_ = auVar56;
  sVar9 = auVar51._10_2_;
  auVar57[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar51[10] - (0xff < sVar9);
  sVar9 = auVar51._12_2_;
  cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar51[0xc] - (0xff < sVar9);
  auVar59[0xe] = cVar8;
  auVar59._0_14_ = auVar57;
  sVar9 = auVar51._14_2_;
  auVar59[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar51[0xe] - (0xff < sVar9);
  sVar9 = (short)((uint)uVar53 >> 0x10);
  sVar10 = (short)((uint6)uVar54 >> 0x20);
  sVar11 = (short)((ulong)uVar55 >> 0x30);
  sVar12 = (short)((unkuint10)auVar56._0_10_ >> 0x40);
  sVar13 = auVar56._10_2_;
  sVar14 = auVar57._12_2_;
  sVar15 = auVar59._14_2_;
  return CONCAT17((0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15),
                  CONCAT16((0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14),
                           CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13),
                                    CONCAT14((0 < sVar12) * (sVar12 < 0x100) * cVar5 -
                                             (0xff < sVar12),
                                             CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar4 -
                                                      (0xff < sVar11),
                                                      CONCAT12((0 < sVar10) * (sVar10 < 0x100) *
                                                               cVar3 - (0xff < sVar10),
                                                               CONCAT11((0 < sVar9) *
                                                                        (sVar9 < 0x100) * cVar2 -
                                                                        (0xff < sVar9),
                                                                        (0 < sVar52) *
                                                                        (sVar52 < 0x100) * cVar1 -
                                                                        (0xff < sVar52))))))));
}

Assistant:

uint64_t helper_paddusb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        int r = vs.ub[i] + vt.ub[i];
        vs.ub[i] = SATUB(r);
    }
    return vs.d;
}